

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O0

FieldBase * __thiscall FIX::FieldMap::getField(FieldMap *this,FieldBase *field)

{
  int tag;
  FieldBase *rhs;
  FieldBase *field_local;
  FieldMap *this_local;
  
  tag = FieldBase::getTag(field);
  rhs = getFieldRef(this,tag);
  FieldBase::operator=(field,rhs);
  return field;
}

Assistant:

FieldBase& getField( FieldBase& field )
  const EXCEPT ( FieldNotFound )
  {
    field = getFieldRef( field.getTag() );
    return field;
  }